

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Projection::Parse
               (IMkvReader *reader,longlong start,longlong size,Projection **projection)

{
  uchar *puVar1;
  longlong lVar2;
  bool bVar3;
  ProjectionType PVar4;
  Projection *this;
  pointer pPVar5;
  long lVar6;
  float fVar7;
  pointer local_b0;
  longlong value_parse_status;
  double value;
  uchar *puStack_90;
  int status_1;
  uchar *data;
  longlong projection_type;
  longlong status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong end;
  undefined1 local_41;
  Projection *local_40;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> local_38;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  Projection **projection_local;
  longlong size_local;
  longlong start_local;
  IMkvReader *reader_local;
  
  if ((reader == (IMkvReader *)0x0) || (*projection != (Projection *)0x0)) {
    reader_local._7_1_ = false;
  }
  else {
    projection_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
    super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
          )(__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
            )projection;
    this = (Projection *)operator_new(0x28,(nothrow_t *)&std::nothrow);
    local_41 = 0;
    local_b0 = (pointer)0x0;
    if (this != (Projection *)0x0) {
      local_41 = 1;
      local_40 = this;
      Projection(this);
      local_b0 = this;
    }
    std::unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>>::
    unique_ptr<std::default_delete<mkvparser::Projection>,void>
              ((unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>> *)
               &local_38,local_b0);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
    if (bVar3) {
      read_pos = start + size;
      child_id = start;
      do {
        if (read_pos <= child_id) {
          pPVar5 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   release(&local_38);
          *(pointer *)
           projection_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl = pPVar5;
          reader_local._7_1_ = true;
          goto LAB_0012e77c;
        }
        child_size = 0;
        status = 0;
        projection_type = ParseElementHeader(reader,&child_id,read_pos,&child_size,&status);
        if (projection_type < 0) {
          reader_local._7_1_ = false;
          goto LAB_0012e77c;
        }
        if (child_size == 0x7671) {
          data = (uchar *)0xffffffffffffffff;
          data = (uchar *)UnserializeUInt(reader,child_id,status);
          if ((long)data < 0) {
            reader_local._7_1_ = false;
            goto LAB_0012e77c;
          }
          PVar4 = (ProjectionType)data;
          pPVar5 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          pPVar5->type = PVar4;
        }
        else if (child_size == 0x7672) {
          pPVar5 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          if (pPVar5->private_data != (uchar *)0x0) {
            reader_local._7_1_ = false;
            goto LAB_0012e77c;
          }
          puStack_90 = SafeArrayAlloc<unsigned_char>(1,status);
          if (puStack_90 == (uchar *)0x0) {
            reader_local._7_1_ = false;
            goto LAB_0012e77c;
          }
          value._4_4_ = (**reader->_vptr_IMkvReader)(reader,child_id,status,puStack_90);
          puVar1 = puStack_90;
          if (value._4_4_ != 0) {
            if (puStack_90 != (uchar *)0x0) {
              operator_delete__(puStack_90);
            }
            reader_local._7_1_ = false;
            goto LAB_0012e77c;
          }
          pPVar5 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          lVar2 = status;
          pPVar5->private_data = puVar1;
          pPVar5 = std::
                   unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
                   operator->(&local_38);
          pPVar5->private_data_length = lVar2;
        }
        else {
          value_parse_status = 0;
          lVar6 = UnserializeFloat(reader,child_id,status,(double *)&value_parse_status);
          if ((((lVar6 < 0) || ((double)value_parse_status < -3.4028234663852886e+38)) ||
              (3.4028234663852886e+38 < (double)value_parse_status)) ||
             ((0.0 < (double)value_parse_status &&
              ((double)value_parse_status < 1.1754943508222875e-38)))) {
            reader_local._7_1_ = false;
            goto LAB_0012e77c;
          }
          if (child_size == 0x7673) {
            fVar7 = (float)(double)value_parse_status;
            pPVar5 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar5->pose_yaw = fVar7;
          }
          else if (child_size == 0x7674) {
            fVar7 = (float)(double)value_parse_status;
            pPVar5 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar5->pose_pitch = fVar7;
          }
          else {
            if (child_size != 0x7675) {
              reader_local._7_1_ = false;
              goto LAB_0012e77c;
            }
            fVar7 = (float)(double)value_parse_status;
            pPVar5 = std::
                     unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     ::operator->(&local_38);
            pPVar5->pose_roll = fVar7;
          }
        }
        child_id = status + child_id;
      } while (child_id <= read_pos);
      reader_local._7_1_ = false;
    }
    else {
      reader_local._7_1_ = false;
    }
LAB_0012e77c:
    end._0_4_ = 1;
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              (&local_38);
  }
  return reader_local._7_1_;
}

Assistant:

bool Projection::Parse(IMkvReader* reader, long long start, long long size,
                       Projection** projection) {
  if (!reader || *projection)
    return false;

  std::unique_ptr<Projection> projection_ptr(new (std::nothrow) Projection());
  if (!projection_ptr)
    return false;

  const long long end = start + size;
  long long read_pos = start;

  while (read_pos < end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvProjectionType) {
      long long projection_type = kTypeNotPresent;
      projection_type = UnserializeUInt(reader, read_pos, child_size);
      if (projection_type < 0)
        return false;

      projection_ptr->type = static_cast<ProjectionType>(projection_type);
    } else if (child_id == libwebm::kMkvProjectionPrivate) {
      if (projection_ptr->private_data != NULL)
        return false;
      unsigned char* data = SafeArrayAlloc<unsigned char>(1, child_size);

      if (data == NULL)
        return false;

      const int status =
          reader->Read(read_pos, static_cast<long>(child_size), data);

      if (status) {
        delete[] data;
        return false;
      }

      projection_ptr->private_data = data;
      projection_ptr->private_data_length = static_cast<size_t>(child_size);
    } else {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      // Make sure value is representable as a float before casting.
      if (value_parse_status < 0 || value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }

      switch (child_id) {
        case libwebm::kMkvProjectionPoseYaw:
          projection_ptr->pose_yaw = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPosePitch:
          projection_ptr->pose_pitch = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPoseRoll:
          projection_ptr->pose_roll = static_cast<float>(value);
          break;
        default:
          return false;
      }
    }

    read_pos += child_size;
    if (read_pos > end)
      return false;
  }

  *projection = projection_ptr.release();
  return true;
}